

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

ProcMemObjCast jx9MemObjCastMethod(sxi32 iFlags)

{
  code *pcStack_10;
  sxi32 iFlags_local;
  
  if ((iFlags & 1U) == 0) {
    if ((iFlags & 2U) == 0) {
      if ((iFlags & 4U) == 0) {
        if ((iFlags & 8U) == 0) {
          if ((iFlags & 0x40U) == 0) {
            pcStack_10 = jx9MemObjToNull;
          }
          else {
            pcStack_10 = jx9MemObjToHashmap;
          }
        }
        else {
          pcStack_10 = jx9MemObjToBool;
        }
      }
      else {
        pcStack_10 = jx9MemObjToReal;
      }
    }
    else {
      pcStack_10 = jx9MemObjToInteger;
    }
  }
  else {
    pcStack_10 = jx9MemObjToString;
  }
  return pcStack_10;
}

Assistant:

JX9_PRIVATE ProcMemObjCast jx9MemObjCastMethod(sxi32 iFlags)
{
	if( iFlags & MEMOBJ_STRING ){
		return jx9MemObjToString;
	}else if( iFlags & MEMOBJ_INT ){
		return jx9MemObjToInteger;
	}else if( iFlags & MEMOBJ_REAL ){
		return jx9MemObjToReal;
	}else if( iFlags & MEMOBJ_BOOL ){
		return jx9MemObjToBool;
	}else if( iFlags & MEMOBJ_HASHMAP ){
		return jx9MemObjToHashmap;
	}
	/* NULL cast */
	return jx9MemObjToNull;
}